

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.hpp
# Opt level: O0

void __thiscall
CholeskyFactor::reduce(CholeskyFactor *this,QpVector *buffer_d,HighsInt maxabsd,bool p_in_v)

{
  value_type vVar1;
  double dVar2;
  int iVar3;
  reference pvVar4;
  const_reference pvVar5;
  const_reference pvVar6;
  undefined1 in_CL;
  int in_EDX;
  int *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  double dVar7;
  CholeskyFactor *unaff_retaddr;
  HighsInt i_4;
  HighsInt idx;
  HighsInt i_3;
  HighsInt r;
  HighsInt col;
  double p_entry;
  HighsInt row_1;
  HighsInt i_2;
  HighsInt i_1;
  HighsInt row;
  HighsInt i;
  vector<double,_std::allocator<double>_> row_p;
  uint p;
  allocator_type *in_stack_ffffffffffffff18;
  value_type vVar8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff20;
  size_type in_stack_ffffffffffffff28;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff30;
  int local_88;
  int local_80;
  int local_7c;
  int local_74;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  vector<double,_std::allocator<double>_> local_38;
  int local_1c;
  undefined3 in_stack_ffffffffffffffe8;
  uint currentk;
  vector<double,_std::allocator<double>_> *m;
  
  currentk = CONCAT13(in_CL,in_stack_ffffffffffffffe8) & 0x1ffffff;
  if ((*(int *)&in_RDI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != 0) &&
     (((ulong)(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start & 1) != 0)) {
    *(int *)((long)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start + 4) =
         *(int *)((long)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start + 4) + 1;
    local_1c = in_EDX;
    m = in_RDI;
    std::allocator<double>::allocator((allocator<double> *)0x75eff2);
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
               (value_type_conflict1 *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    std::allocator<double>::~allocator((allocator<double> *)0x75f020);
    for (local_58 = 0;
        local_58 <
        *(int *)&in_RDI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start; local_58 = local_58 + 1) {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)
                          &in_RDI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish,
                          (ulong)(uint)(local_1c *
                                        *(int *)((long)&in_RDI[1].
                                                                                                                
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 4) +
                                       local_58));
      vVar8 = *pvVar4;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_38,(long)local_58);
      *pvVar4 = vVar8;
    }
    for (local_5c = local_1c;
        local_5c <
        *(int *)&in_RDI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + -1; local_5c = local_5c + 1) {
      for (local_60 = 0;
          local_60 <
          *(int *)&in_RDI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start; local_60 = local_60 + 1) {
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)
                            &in_RDI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish,
                            (long)((local_5c + 1) *
                                   *(int *)((long)&in_RDI[1].
                                                                                                      
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 4) +
                                  local_60));
        vVar8 = *pvVar4;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)
                            &in_RDI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish,
                            (long)(local_5c *
                                   *(int *)((long)&in_RDI[1].
                                                                                                      
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 4) +
                                  local_60));
        *pvVar4 = vVar8;
      }
    }
    for (local_64 = 0;
        local_64 <
        *(int *)&in_RDI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start; local_64 = local_64 + 1) {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_38,(long)local_64);
      vVar8 = *pvVar4;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)
                          &in_RDI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish,
                          (long)((*(int *)&in_RDI[1].
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_start + -1) *
                                 *(int *)((long)&in_RDI[1].
                                                 super__Vector_base<double,_std::allocator<double>_>
                                                 ._M_impl.super__Vector_impl_data._M_start + 4) +
                                local_64));
      *pvVar4 = vVar8;
    }
    for (local_68 = 0;
        local_68 <
        *(int *)&in_RDI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start; local_68 = local_68 + 1) {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)
                          &in_RDI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish,
                          (ulong)(uint)(local_68 *
                                        *(int *)((long)&in_RDI[1].
                                                                                                                
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 4) +
                                       local_1c));
      vVar8 = *pvVar4;
      for (local_74 = local_1c;
          local_74 <
          *(int *)&in_RDI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start + -1; local_74 = local_74 + 1) {
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)
                            &in_RDI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish,
                            (long)(local_68 *
                                   *(int *)((long)&in_RDI[1].
                                                                                                      
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 4) +
                                   local_74 + 1));
        vVar1 = *pvVar4;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)
                            &in_RDI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish,
                            (long)(local_68 *
                                   *(int *)((long)&in_RDI[1].
                                                                                                      
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 4) +
                                  local_74));
        *pvVar4 = vVar1;
      }
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)
                          &in_RDI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish,
                          (long)(local_68 *
                                 *(int *)((long)&in_RDI[1].
                                                 super__Vector_base<double,_std::allocator<double>_>
                                                 ._M_impl.super__Vector_impl_data._M_start + 4) +
                                 *(int *)&in_RDI[1].
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_start + -1));
      *pvVar4 = vVar8;
    }
    if (*(int *)&in_RDI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start == 1) {
      *(int *)&in_RDI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start =
           *(int *)&in_RDI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start + -1;
    }
    else {
      local_7c = local_1c;
      if ((currentk & 0x1000000) == 0) {
        while (local_7c = local_7c + -1, -1 < local_7c) {
          eliminate(unaff_retaddr,m,(HighsInt)((ulong)in_RSI >> 0x20),(HighsInt)in_RSI,in_EDX,
                    currentk);
        }
        for (local_80 = 0; local_80 < *in_RSI; local_80 = local_80 + 1) {
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RSI + 2),(long)local_80);
          iVar3 = *pvVar5;
          if (iVar3 != in_EDX) {
            if (iVar3 < in_EDX) {
              pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)(in_RSI + 8),
                                  (long)iVar3);
              in_stack_ffffffffffffff20 =
                   (vector<double,_std::allocator<double>_> *)((ulong)*pvVar6 ^ 0x8000000000000000);
              pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)(in_RSI + 8),
                                  (long)in_EDX);
              dVar7 = (double)in_stack_ffffffffffffff20 / *pvVar6;
              pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)
                                  &in_RDI[1].super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_finish,
                                  (long)((*(int *)&in_RDI[1].
                                                                                                      
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + -1) *
                                         *(int *)((long)&in_RDI[1].
                                                                                                                  
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 4) +
                                         *(int *)&in_RDI[1].
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + -1));
              vVar8 = *pvVar4;
              pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)
                                  &in_RDI[1].super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_finish,
                                  (long)((*(int *)&in_RDI[1].
                                                                                                      
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + -1) *
                                         *(int *)((long)&in_RDI[1].
                                                                                                                  
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 4) +
                                        iVar3));
              *pvVar4 = dVar7 * vVar8 + *pvVar4;
            }
            else {
              pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)(in_RSI + 8),
                                  (long)iVar3);
              dVar7 = *pvVar6;
              pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)(in_RSI + 8),
                                  (long)in_EDX);
              dVar2 = *pvVar6;
              pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)
                                  &in_RDI[1].super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_finish,
                                  (long)((*(int *)&in_RDI[1].
                                                                                                      
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + -1) *
                                         *(int *)((long)&in_RDI[1].
                                                                                                                  
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 4) +
                                         *(int *)&in_RDI[1].
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + -1));
              vVar8 = *pvVar4;
              pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)
                                  &in_RDI[1].super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_finish,
                                  (long)((*(int *)&in_RDI[1].
                                                                                                      
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + -1) *
                                         *(int *)((long)&in_RDI[1].
                                                                                                                  
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 4) +
                                         iVar3 + -1));
              *pvVar4 = (-dVar7 / dVar2) * vVar8 + *pvVar4;
            }
          }
        }
      }
      for (local_88 = 0;
          local_88 <
          *(int *)&in_RDI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start + -1; local_88 = local_88 + 1) {
        eliminate(unaff_retaddr,m,(HighsInt)((ulong)in_RSI >> 0x20),(HighsInt)in_RSI,in_EDX,currentk
                 );
      }
      *(int *)&in_RDI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start =
           *(int *)&in_RDI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start + -1;
    }
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_ffffffffffffff20);
  }
  return;
}

Assistant:

void reduce(const QpVector& buffer_d, const HighsInt maxabsd, bool p_in_v) {
    if (current_k == 0) {
      return;
    }
    if (!uptodate) {
      return;
    }
    numberofreduces++;

    unsigned p = maxabsd;  // col we push to the right and remove

    // start situation: p=3, current_k = 5
    // |1 x  | |x    |       |1   | |xxxxx|
    // | 1x  | |xx   |  ===  | 1  | | xxxx|
    // |  x1 | |xxx  |       |xxxx| |  xxx|
    // |  x 1| |xxxx |       |  1 | |   xx|
    //         |xxxxx|       |   1| |    x|
    // next step: move row/col p to the bottom/right

    //> save row p
    std::vector<double> row_p(current_k, 0.0);
    for (HighsInt i = 0; i < current_k; i++) {
      row_p[i] = L[p * current_k_max + i];
    }

    //> move all rows > p up by one row
    for (HighsInt row = p; row < current_k - 1; row++) {
      for (HighsInt i = 0; i < current_k; i++) {
        L[row * current_k_max + i] = L[(row + 1) * current_k_max + i];
      }
    }

    //> load row p
    for (HighsInt i = 0; i < current_k; i++) {
      L[(current_k - 1) * current_k_max + i] = row_p[i];
    }

    //> now move col p to the right in each row
    for (HighsInt row = 0; row < current_k; row++) {
      double p_entry = L[row * current_k_max + p];
      for (HighsInt col = p; col < current_k - 1; col++) {
        L[row * current_k_max + col] = L[row * current_k_max + col + 1];
      }
      L[row * current_k_max + current_k - 1] = p_entry;
    }

    if (current_k == 1) {
      current_k--;
      return;
    }

    if (!p_in_v) {
      // situation now:
      // |1   x| |x    |       |1   | |xxxxx|
      // | 1  x| |xx   |  ===  | 1  | | xxxx|
      // |  1 x| |xxx x|       |  1 | |  xx |
      // |   1x| |xxxxx|       |   1| |   x |
      //         |xx  x|       |xxxx| |  xxx|
      // next: remove nonzero entries in last column except for diagonal element
      for (HighsInt r = (HighsInt)p - 1; r >= 0; r--) {  // to current_k-1
        eliminate(L, current_k - 1, r, current_k_max, current_k);
      }

      // situation now:
      // |1   x| |x   x|        |xxxx | |1   |
      // | 1  x| |xx  x|  ===   | xxx | | 1  |
      // |  1 x| |xxx x|        |  xx | |  1 |
      // |   1x| |xxxxx|        |   x | |   1|
      //         |    x|        |xxxxx| |xxxx|
      // next: multiply product
      // new last row: old last row (first current_k-1 elements) + r *
      // R_current_k_current_k

      for (HighsInt i = 0; i < buffer_d.num_nz; i++) {
        HighsInt idx = buffer_d.index[i];
        if (idx == maxabsd) {
          continue;
        }
        if (idx < maxabsd) {
          L[(current_k - 1) * current_k_max + idx] +=
              -buffer_d.value[idx] / buffer_d.value[maxabsd] *
              L[(current_k - 1) * current_k_max + current_k - 1];
        } else {
          L[(current_k - 1) * current_k_max + idx - 1] +=
              -buffer_d.value[idx] / buffer_d.value[maxabsd] *
              L[(current_k - 1) * current_k_max + current_k - 1];
        }
      }
      // situation now: as above, but no more product
    }
    // next: eliminate last row
    for (HighsInt i = 0; i < current_k - 1; i++) {
      eliminate(L, i, current_k - 1, current_k_max, current_k);
    }
    current_k--;
  }